

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O2

void __thiscall gmlc::concurrency::TriggerVariable::waitActivation(TriggerVariable *this)

{
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->activeLock);
  if (((this->activated)._M_base._M_i & 1U) == 0) {
    std::condition_variable::
    wait<gmlc::concurrency::TriggerVariable::waitActivation()const::_lambda()_1_>
              (&this->cv_active,&uStack_18,(anon_class_8_1_8991fb9c)this);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return;
}

Assistant:

void waitActivation() const
    {
        std::unique_lock<std::mutex> lk(activeLock);
        if (!activated) {
            cv_active.wait(lk, [this] { return activated.load(); });
        }
    }